

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

Event * __thiscall EventQueue::WaitEvent(EventQueue *this,uint32_t mstimeout)

{
  bool bVar1;
  Event *pEVar2;
  Event *pEVar3;
  AutoLock _auto_lock_;
  
  AutoLock::AutoLock(&_auto_lock_,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x58);
  pEVar2 = pollEventInternal(this);
  do {
    while( true ) {
      pEVar3 = pEVar2;
      if (pEVar3 != (Event *)0x0) goto LAB_00117ffa;
      bVar1 = Condition::Wait(&this->mWait,&this->mLock,mstimeout);
      if (!bVar1) break;
      pEVar2 = pollEventInternal(this);
      if (pEVar2 == (Event *)0x0) {
        jh_log_print(0,"Event *EventQueue::WaitEvent(uint32_t)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,100,"Signalled empty queue");
        pEVar2 = (Event *)0x0;
      }
    }
    pEVar2 = (Event *)0x0;
  } while (mstimeout == 0);
LAB_00117ffa:
  AutoLock::~AutoLock(&_auto_lock_);
  return pEVar3;
}

Assistant:

Event *EventQueue::WaitEvent( uint32_t mstimeout )
{
	TRACE_BEGIN( LOG_LVL_NOISE );

	DebugAutoLock( mLock );
	Event *ev = pollEventInternal();

	while ( ev == NULL )
	{
		LOG( "timeout %d", mstimeout );
		if ( mWait.Wait( mLock, mstimeout ) )
		{
			LOG( "signalled" );
			ev = pollEventInternal();
			if ( ev == NULL )
			{
				LOG_ERR( "Signalled empty queue" );
			}
		}
		else if ( mstimeout > 0 )
			return NULL;
		
		LOG( "done" );
	}	
	
	return ev;
}